

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

void parse_feature_tweaks(options_i *options,vw *all)

{
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first_00;
  byte bVar1;
  bool bVar2;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *ptVar3;
  vw *all_00;
  hash_func_t required_length;
  size_type sVar4;
  ostream *poVar5;
  reference pcVar6;
  uchar *puVar7;
  undefined8 uVar8;
  byte *pbVar9;
  reference pbVar10;
  char *pcVar11;
  ulong uVar12;
  reference pvVar13;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  long *in_RDI;
  size_t id_1;
  size_t index;
  size_t previous;
  char delimiter;
  string PATH;
  string path;
  iterator __end3_3;
  iterator __begin3_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_3;
  size_t i_14;
  uchar c;
  size_t i_13;
  stringstream __msg_3;
  size_t i_12;
  uchar new_namespace;
  bool operator_found;
  size_t operator_pos;
  size_t arg_len;
  string argument;
  iterator arg_iter;
  size_t i_11;
  char character_2;
  const_iterator __end4_2;
  const_iterator __begin4_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__range4_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *keep;
  iterator __end3_2;
  iterator __begin3_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_2;
  const_iterator j_2;
  iterator i_10;
  size_t i_9;
  char character_1;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__range4_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ignore_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  const_iterator j_1;
  iterator i_8;
  char character;
  const_iterator __end4;
  const_iterator __begin4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__range4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ignore;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  const_iterator j;
  iterator i_7;
  size_t i_6;
  size_t len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i_5;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  size_t sorted_cnt;
  size_t removed_cnt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exp_inter;
  iterator i_4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exp_cubic;
  iterator i_3;
  iterator i_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expanded_interactions;
  stringstream __msg_2;
  size_t i_1;
  stringstream __msg_1;
  size_t i;
  stringstream __msg;
  size_t id;
  option_group_definition feature_options;
  string q_colon;
  string affix;
  bool leave_duplicate_interactions;
  bool noconstant;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dictionary_path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dictionary_nses;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  redefines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keeps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignore_linears;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignores;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interactions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cubics;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  quadratics;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  spelling_ns;
  uint32_t new_bits;
  string hash_function;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffc398;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffc3a0;
  string *in_stack_ffffffffffffc3a8;
  typed_option<unsigned_int> *in_stack_ffffffffffffc3b0;
  string *in_stack_ffffffffffffc3b8;
  undefined8 in_stack_ffffffffffffc3c0;
  int iVar14;
  char *in_stack_ffffffffffffc3c8;
  allocator *paVar15;
  vw_exception *in_stack_ffffffffffffc3d0;
  undefined7 in_stack_ffffffffffffc3e0;
  undefined1 in_stack_ffffffffffffc3e7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffc3e8;
  undefined6 in_stack_ffffffffffffc3f0;
  undefined1 in_stack_ffffffffffffc3f6;
  undefined1 in_stack_ffffffffffffc3f7;
  const_iterator in_stack_ffffffffffffc3f8;
  undefined7 in_stack_ffffffffffffc408;
  undefined1 in_stack_ffffffffffffc40f;
  string *in_stack_ffffffffffffc428;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffc438;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffc440;
  undefined1 in_stack_ffffffffffffc467;
  uint32_t *in_stack_ffffffffffffc468;
  long *plVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffc470;
  undefined8 in_stack_ffffffffffffc478;
  undefined1 uVar17;
  char *in_stack_ffffffffffffc480;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ptVar18;
  undefined7 in_stack_ffffffffffffc488;
  undefined1 in_stack_ffffffffffffc48f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffc490;
  size_t *in_stack_ffffffffffffc518;
  size_t *in_stack_ffffffffffffc520;
  undefined8 in_stack_ffffffffffffc528;
  iterator in_stack_ffffffffffffc530;
  undefined7 in_stack_ffffffffffffc568;
  undefined1 in_stack_ffffffffffffc56f;
  vw *in_stack_ffffffffffffc570;
  byte local_39c2;
  string *err_msg;
  string *str;
  string local_3500 [32];
  ulong local_34e0;
  string local_34d8 [32];
  string local_34b8 [32];
  long local_3498;
  long local_3490;
  undefined1 local_3482;
  allocator local_3481;
  string local_3480 [39];
  allocator local_3459;
  string local_3458 [39];
  allocator local_3431;
  string local_3430 [32];
  string local_3410 [32];
  string local_33f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_33d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_33c8;
  undefined1 *local_33c0;
  allocator local_33b1;
  string local_33b0 [39];
  allocator local_3389;
  string local_3388 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3368;
  ulong local_3360;
  byte local_3351;
  ulong local_3350;
  undefined1 local_3341;
  stringstream local_3320 [16];
  stringstream local_3310 [232];
  string *in_stack_ffffffffffffcdd8;
  vw *in_stack_ffffffffffffcde0;
  ulong local_3198;
  uchar local_318a;
  ulong local_3188;
  string local_3178 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3158;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3150;
  ulong local_3148;
  allocator local_3139;
  string local_3138 [39];
  char local_3111;
  undefined8 local_3110;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3108;
  reference local_3100;
  reference local_30f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30f0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30e8;
  undefined1 *local_30e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30d8;
  char *local_30d0;
  undefined8 local_30c8;
  undefined8 local_30c0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30b8;
  string local_30b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3090;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3088;
  ulong local_3080;
  allocator local_3071;
  string local_3070 [39];
  char local_3049;
  undefined8 local_3048;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3040;
  reference local_3038;
  reference local_3030;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3028;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3020;
  undefined1 *local_3018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3010;
  char *local_3008;
  undefined8 local_3000;
  undefined8 local_2ff8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2ff0;
  string local_2fe8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2fc8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2fc0;
  allocator local_2fb1;
  string local_2fb0 [39];
  char local_2f89;
  undefined8 local_2f88;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f80;
  reference local_2f78;
  reference local_2f70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f68;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2f60;
  undefined1 *local_2f58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f50;
  char *local_2f48;
  undefined8 local_2f40;
  undefined8 local_2f38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f30;
  string local_2f28 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f08;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2f00;
  allocator local_2ef1;
  string local_2ef0 [32];
  ulong local_2ed0;
  long local_2ec8;
  reference local_2ec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2eb8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2eb0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2ea8;
  ulong local_2ea0;
  ulong local_2e98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e78;
  allocator local_2e61;
  string local_2e60 [56];
  string local_2e28 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e08;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2e00;
  allocator local_2df1;
  string local_2df0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2dd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2dc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2dc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2db8;
  allocator local_2da1;
  string local_2da0 [56];
  string local_2d68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d48;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2d40;
  allocator local_2d31;
  string local_2d30 [39];
  allocator local_2d09;
  string local_2d08 [56];
  string local_2cd0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2cb0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2ca8;
  allocator local_2c99;
  string local_2c98 [37];
  byte local_2c73;
  byte local_2c72;
  allocator local_2c71;
  string local_2c70 [37];
  byte local_2c4b;
  byte local_2c4a;
  allocator local_2c49;
  string local_2c48 [37];
  byte local_2c23;
  byte local_2c22;
  allocator local_2c21;
  string local_2c20 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c00;
  undefined1 local_2be1;
  stringstream local_2bc0 [16];
  ostream local_2bb0;
  allocator local_2a31;
  string local_2a30 [63];
  allocator local_29f1;
  string local_29f0 [56];
  string local_29b8 [32];
  ulong local_2998;
  undefined1 local_2989;
  stringstream local_2968 [16];
  ostream local_2958;
  allocator local_27d9;
  string local_27d8 [39];
  allocator local_27b1;
  string local_27b0 [56];
  string local_2778 [32];
  ulong local_2758;
  undefined1 local_2749;
  stringstream local_2728 [16];
  ostream local_2718;
  allocator local_2599;
  string local_2598 [39];
  allocator local_2571;
  string local_2570 [32];
  string local_2550 [39];
  allocator local_2529;
  string local_2528 [32];
  string local_2508 [32];
  ulong local_24e8;
  undefined1 local_24d9 [40];
  allocator local_24b1;
  string local_24b0 [39];
  allocator local_2489;
  string local_2488 [32];
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2468 [2];
  allocator local_2321;
  string local_2320 [39];
  allocator local_22f9;
  string local_22f8 [359];
  allocator local_2191;
  string local_2190 [39];
  allocator local_2169;
  string local_2168 [39];
  allocator local_2141;
  string local_2140 [359];
  allocator local_1fd9;
  string local_1fd8 [39];
  allocator local_1fb1;
  string local_1fb0 [359];
  allocator local_1e49;
  string local_1e48 [39];
  allocator local_1e21;
  string local_1e20 [359];
  allocator local_1cb9;
  string local_1cb8 [39];
  allocator local_1c91;
  string local_1c90 [32];
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c70 [2];
  allocator local_1b29;
  string local_1b28 [39];
  allocator local_1b01;
  string local_1b00 [359];
  allocator local_1999;
  string local_1998 [39];
  allocator local_1971;
  string local_1970 [32];
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1950 [2];
  allocator local_1809;
  string local_1808 [39];
  allocator local_17e1;
  string local_17e0 [32];
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_17c0 [2];
  allocator local_1679;
  string local_1678 [39];
  allocator local_1651;
  string local_1650 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1630 [2];
  allocator local_14e9;
  string local_14e8 [39];
  undefined1 local_14c1 [360];
  allocator local_1359;
  string local_1358 [39];
  allocator local_1331;
  string local_1330 [359];
  allocator local_11c9;
  string local_11c8 [39];
  allocator local_11a1;
  string local_11a0 [359];
  allocator local_1039;
  string local_1038 [39];
  allocator local_1011;
  string local_1010 [39];
  allocator local_fe9;
  string local_fe8 [359];
  allocator local_e81;
  string local_e80 [39];
  allocator local_e59;
  string local_e58 [359];
  allocator local_cf1;
  string local_cf0 [39];
  allocator local_cc9;
  string local_cc8 [39];
  allocator local_ca1;
  string local_ca0 [359];
  allocator local_b39;
  string local_b38 [39];
  allocator local_b11;
  string local_b10 [32];
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_af0 [2];
  allocator local_9a9;
  string local_9a8 [39];
  allocator local_981;
  string local_980 [32];
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_960 [2];
  allocator local_819;
  string local_818 [39];
  allocator local_7f1;
  string local_7f0 [32];
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_7d0 [2];
  allocator local_689;
  string local_688 [39];
  allocator local_661;
  string local_660 [32];
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_640 [2];
  allocator local_4f9;
  string local_4f8 [39];
  allocator local_4d1;
  string local_4d0 [32];
  typed_option<unsigned_int> local_4b0 [2];
  allocator local_369;
  string local_368 [39];
  allocator local_341;
  string local_340 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_320 [2];
  allocator local_1d9;
  string local_1d8 [32];
  undefined1 local_1b8 [56];
  string local_180 [32];
  string local_160 [39];
  byte local_139;
  undefined1 local_138 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120 [2];
  undefined1 local_f0 [24];
  undefined1 local_d8 [24];
  undefined1 local_c0 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  uint local_48;
  allocator local_31;
  string local_30 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  long *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"strings",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12a0a4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12a0b1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12a0be);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12a0cb);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12a0d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12a0e5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12a0f2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12a0ff);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12a10c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12a119);
  std::__cxx11::string::string(local_160);
  std::__cxx11::string::string(local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"Feature options",&local_1d9);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffc3a0,
             (string *)in_stack_ffffffffffffc398);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"hash",&local_341);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffc3a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc3a0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(local_320,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_368,"how to hash the features. Available options: strings, all",&local_369);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_ffffffffffffc3a0,(string *)in_stack_ffffffffffffc398);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(in_stack_ffffffffffffc3a0,in_stack_ffffffffffffc398);
  VW::config::option_group_definition::add<std::__cxx11::string>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffc3f7,
                      CONCAT16(in_stack_ffffffffffffc3f6,in_stack_ffffffffffffc3f0)),
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffc3e8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4d0,"hash_seed",&local_4d1);
  VW::config::make_option<unsigned_int>(in_stack_ffffffffffffc3a8,(uint *)in_stack_ffffffffffffc3a0)
  ;
  VW::config::typed_option<unsigned_int>::keep(local_4b0,true);
  VW::config::typed_option<unsigned_int>::default_value
            (in_stack_ffffffffffffc3b0,(uint)((ulong)in_stack_ffffffffffffc3a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f8,"seed for hash function",&local_4f9);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffc3a0,
             (string *)in_stack_ffffffffffffc398);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffc3a0,
             (typed_option<unsigned_int> *)in_stack_ffffffffffffc398);
  VW::config::option_group_definition::add<unsigned_int>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffc3f7,
                      CONCAT16(in_stack_ffffffffffffc3f6,in_stack_ffffffffffffc3f0)),
             (typed_option<unsigned_int> *)in_stack_ffffffffffffc3e8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_660,"ignore",&local_661);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffc3a8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffc3a0);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::keep(local_640,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_688,"ignore namespaces beginning with character <arg>",&local_689);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffc3a0,(string *)in_stack_ffffffffffffc398);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc3a0,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc398);
  VW::config::option_group_definition::
  add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffc3f7,
                      CONCAT16(in_stack_ffffffffffffc3f6,in_stack_ffffffffffffc3f0)),
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffc3e8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7f0,"ignore_linear",&local_7f1);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffc3a8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffc3a0);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::keep(local_7d0,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_818,"ignore namespaces beginning with character <arg> for linear terms only",
             &local_819);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffc3a0,(string *)in_stack_ffffffffffffc398);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc3a0,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc398);
  VW::config::option_group_definition::
  add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffc3f7,
                      CONCAT16(in_stack_ffffffffffffc3f6,in_stack_ffffffffffffc3f0)),
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffc3e8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_980,"keep",&local_981);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffc3a8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffc3a0);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::keep(local_960,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_9a8,"keep namespaces beginning with character <arg>",&local_9a9);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffc3a0,(string *)in_stack_ffffffffffffc398);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc3a0,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc398);
  VW::config::option_group_definition::
  add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffc3f7,
                      CONCAT16(in_stack_ffffffffffffc3f6,in_stack_ffffffffffffc3f0)),
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffc3e8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b10,"redefine",&local_b11);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffc3a8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffc3a0);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::keep(local_af0,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b38,
             "redefine namespaces beginning with characters of string S as namespace N. <arg> shall be in form \'N:=S\' where := is operator. Empty N or S are treated as default namespace. Use \':\' as a wildcard in S."
             ,&local_b39);
  ptVar3 = VW::config::
           typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0,(string *)in_stack_ffffffffffffc398);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::keep(ptVar3,true);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc3a0,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc398);
  VW::config::option_group_definition::
  add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffc3f7,
                      CONCAT16(in_stack_ffffffffffffc3f6,in_stack_ffffffffffffc3f0)),
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffc3e8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ca0,"bit_precision",&local_ca1);
  VW::config::make_option<unsigned_int>(in_stack_ffffffffffffc3a8,(uint *)in_stack_ffffffffffffc3a0)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cc8,"b",&local_cc9);
  VW::config::typed_option<unsigned_int>::short_name
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffc3a0,
             (string *)in_stack_ffffffffffffc398);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cf0,"number of bits in the feature table",&local_cf1);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffc3a0,
             (string *)in_stack_ffffffffffffc398);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffc3a0,
             (typed_option<unsigned_int> *)in_stack_ffffffffffffc398);
  VW::config::option_group_definition::add<unsigned_int>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffc3f7,
                      CONCAT16(in_stack_ffffffffffffc3f6,in_stack_ffffffffffffc3f0)),
             (typed_option<unsigned_int> *)in_stack_ffffffffffffc3e8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e58,"noconstant",&local_e59);
  VW::config::make_option<bool>(in_stack_ffffffffffffc3a8,(bool *)in_stack_ffffffffffffc3a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e80,"Don\'t add a constant feature",&local_e81);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffc3a0,(string *)in_stack_ffffffffffffc398);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffc3a0,
             (typed_option<bool> *)in_stack_ffffffffffffc398);
  VW::config::option_group_definition::add<bool>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffc3f7,
                      CONCAT16(in_stack_ffffffffffffc3f6,in_stack_ffffffffffffc3f0)),
             (typed_option<bool> *)in_stack_ffffffffffffc3e8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fe8,"constant",&local_fe9);
  VW::config::make_option<float>(in_stack_ffffffffffffc3a8,(float *)in_stack_ffffffffffffc3a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1010,"C",&local_1011);
  VW::config::typed_option<float>::short_name
            ((typed_option<float> *)in_stack_ffffffffffffc3a0,(string *)in_stack_ffffffffffffc398);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1038,"Set initial value of constant",&local_1039);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffc3a0,(string *)in_stack_ffffffffffffc398);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffc3a0,
             (typed_option<float> *)in_stack_ffffffffffffc398);
  VW::config::option_group_definition::add<float>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffc3f7,
                      CONCAT16(in_stack_ffffffffffffc3f6,in_stack_ffffffffffffc3f0)),
             (typed_option<float> *)in_stack_ffffffffffffc3e8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11a0,"ngram",&local_11a1);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffc3a8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffc3a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_11c8,
             "Generate N grams. To generate N grams for a single namespace \'foo\', arg should be fN."
             ,&local_11c9);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffc3a0,(string *)in_stack_ffffffffffffc398);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc3a0,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc398);
  VW::config::option_group_definition::
  add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffc3f7,
                      CONCAT16(in_stack_ffffffffffffc3f6,in_stack_ffffffffffffc3f0)),
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffc3e8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1330,"skips",&local_1331);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffc3a8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffc3a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1358,
             "Generate skips in N grams. This in conjunction with the ngram tag can be used to generate generalized n-skip-k-gram. To generate n-skips for a single namespace \'foo\', arg should be fN."
             ,&local_1359);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffc3a0,(string *)in_stack_ffffffffffffc398);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc3a0,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc398);
  all_00 = (vw *)VW::config::option_group_definition::
                 add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                           ((option_group_definition *)
                            CONCAT17(in_stack_ffffffffffffc3f7,
                                     CONCAT16(in_stack_ffffffffffffc3f6,in_stack_ffffffffffffc3f0)),
                            (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffc3e8._M_current);
  str = (string *)local_14c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_14c1 + 1),"feature_limit",(allocator *)str);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffc3a8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffc3a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_14e8,
             "limit to N features. To apply to a single namespace \'foo\', arg should be fN",
             &local_14e9);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffc3a0,(string *)in_stack_ffffffffffffc398);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc3a0,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc398);
  VW::config::option_group_definition::
  add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffc3f7,
                      CONCAT16(in_stack_ffffffffffffc3f6,in_stack_ffffffffffffc3f0)),
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffc3e8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1650,"affix",&local_1651);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffc3a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc3a0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(local_1630,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1678,
             "generate prefixes/suffixes of features; argument \'+2a,-3b,+1\' means generate 2-char prefixes for namespace a, 3-char suffixes for b and 1 char prefixes for default namespace"
             ,&local_1679);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_ffffffffffffc3a0,(string *)in_stack_ffffffffffffc398);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(in_stack_ffffffffffffc3a0,in_stack_ffffffffffffc398);
  VW::config::option_group_definition::add<std::__cxx11::string>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffc3f7,
                      CONCAT16(in_stack_ffffffffffffc3f6,in_stack_ffffffffffffc3f0)),
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffc3e8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_17e0,"spelling",&local_17e1);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffc3a8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffc3a0);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::keep(local_17c0,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1808,
             "compute spelling features for a give namespace (use \'_\' for default namespace)",
             &local_1809);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffc3a0,(string *)in_stack_ffffffffffffc398);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc3a0,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc398);
  VW::config::option_group_definition::
  add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffc3f7,
                      CONCAT16(in_stack_ffffffffffffc3f6,in_stack_ffffffffffffc3f0)),
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffc3e8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1970,"dictionary",&local_1971);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffc3a8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffc3a0);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::keep(local_1950,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1998,
             "read a dictionary for additional features (arg either \'x:file\' or just \'file\')",
             &local_1999);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffc3a0,(string *)in_stack_ffffffffffffc398);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc3a0,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc398);
  VW::config::option_group_definition::
  add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffc3f7,
                      CONCAT16(in_stack_ffffffffffffc3f6,in_stack_ffffffffffffc3f0)),
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffc3e8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b00,"dictionary_path",&local_1b01);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffc3a8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffc3a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1b28,
             "look in this directory for dictionaries; defaults to current directory or env{PATH}",
             &local_1b29);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffc3a0,(string *)in_stack_ffffffffffffc398);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc3a0,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc398);
  VW::config::option_group_definition::
  add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffc3f7,
                      CONCAT16(in_stack_ffffffffffffc3f6,in_stack_ffffffffffffc3f0)),
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffc3e8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c90,"interactions",&local_1c91);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffc3a8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffc3a0);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::keep(local_1c70,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1cb8,"Create feature interactions of any level between namespaces.",&local_1cb9);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffc3a0,(string *)in_stack_ffffffffffffc398);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc3a0,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc398);
  VW::config::option_group_definition::
  add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffc3f7,
                      CONCAT16(in_stack_ffffffffffffc3f6,in_stack_ffffffffffffc3f0)),
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffc3e8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e20,"permutations",&local_1e21);
  VW::config::make_option<bool>(in_stack_ffffffffffffc3a8,(bool *)in_stack_ffffffffffffc3a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1e48,
             "Use permutations instead of combinations for feature interactions of same namespace.",
             &local_1e49);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffc3a0,(string *)in_stack_ffffffffffffc398);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffc3a0,
             (typed_option<bool> *)in_stack_ffffffffffffc398);
  VW::config::option_group_definition::add<bool>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffc3f7,
                      CONCAT16(in_stack_ffffffffffffc3f6,in_stack_ffffffffffffc3f0)),
             (typed_option<bool> *)in_stack_ffffffffffffc3e8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1fb0,"leave_duplicate_interactions",&local_1fb1);
  VW::config::make_option<bool>(in_stack_ffffffffffffc3a8,(bool *)in_stack_ffffffffffffc3a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1fd8,
             "Don\'t remove interactions with duplicate combinations of namespaces. For ex. this is a duplicate: \'-q ab -q ba\' and a lot more in \'-q ::\'."
             ,&local_1fd9);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffc3a0,(string *)in_stack_ffffffffffffc398);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffc3a0,
             (typed_option<bool> *)in_stack_ffffffffffffc398);
  VW::config::option_group_definition::add<bool>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffc3f7,
                      CONCAT16(in_stack_ffffffffffffc3f6,in_stack_ffffffffffffc3f0)),
             (typed_option<bool> *)in_stack_ffffffffffffc3e8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2140,"quadratic",&local_2141);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffc3a8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffc3a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2168,"q",&local_2169);
  ptVar3 = VW::config::
           typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::short_name((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffc3a0,(string *)in_stack_ffffffffffffc398);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::keep(ptVar3,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2190,"Create and use quadratic features",&local_2191);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffc3a0,(string *)in_stack_ffffffffffffc398);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc3a0,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc398);
  VW::config::option_group_definition::
  add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffc3f7,
                      CONCAT16(in_stack_ffffffffffffc3f6,in_stack_ffffffffffffc3f0)),
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffc3e8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_22f8,"q:",&local_22f9);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffc3a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc3a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2320,": corresponds to a wildcard for all printable characters",&local_2321);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_ffffffffffffc3a0,(string *)in_stack_ffffffffffffc398);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(in_stack_ffffffffffffc3a0,in_stack_ffffffffffffc398);
  VW::config::option_group_definition::add<std::__cxx11::string>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffc3f7,
                      CONCAT16(in_stack_ffffffffffffc3f6,in_stack_ffffffffffffc3f0)),
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffc3e8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2488,"cubic",&local_2489);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffc3a8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffc3a0);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::keep(local_2468,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_24b0,"Create and use cubic features",&local_24b1);
  ptVar3 = VW::config::
           typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0,(string *)in_stack_ffffffffffffc398);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc3a0,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffc398);
  VW::config::option_group_definition::
  add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((option_group_definition *)
             CONCAT17(in_stack_ffffffffffffc3f7,
                      CONCAT16(in_stack_ffffffffffffc3f6,in_stack_ffffffffffffc3f0)),
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_ffffffffffffc3e8._M_current);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_24b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_24b1);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_2488);
  std::allocator<char>::~allocator((allocator<char> *)&local_2489);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_2320);
  std::allocator<char>::~allocator((allocator<char> *)&local_2321);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_22f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_22f9);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_2190);
  std::allocator<char>::~allocator((allocator<char> *)&local_2191);
  std::__cxx11::string::~string(local_2168);
  std::allocator<char>::~allocator((allocator<char> *)&local_2169);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_2140);
  std::allocator<char>::~allocator((allocator<char> *)&local_2141);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_1fd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1fd9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_1fb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1fb1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_1e48);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e49);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_1e20);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e21);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_1cb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1cb9);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_1c90);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c91);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_1b28);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b29);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_1b00);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b01);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_1998);
  std::allocator<char>::~allocator((allocator<char> *)&local_1999);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_1970);
  std::allocator<char>::~allocator((allocator<char> *)&local_1971);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_1808);
  std::allocator<char>::~allocator((allocator<char> *)&local_1809);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_17e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_17e1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_1678);
  std::allocator<char>::~allocator((allocator<char> *)&local_1679);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_1650);
  std::allocator<char>::~allocator((allocator<char> *)&local_1651);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_14e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_14e9);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string((string *)(local_14c1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_14c1);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_1358);
  std::allocator<char>::~allocator((allocator<char> *)&local_1359);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_1330);
  std::allocator<char>::~allocator((allocator<char> *)&local_1331);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_11c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_11c9);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_11a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_11a1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_1038);
  std::allocator<char>::~allocator((allocator<char> *)&local_1039);
  std::__cxx11::string::~string(local_1010);
  std::allocator<char>::~allocator((allocator<char> *)&local_1011);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_fe8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fe9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_e80);
  std::allocator<char>::~allocator((allocator<char> *)&local_e81);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_e58);
  std::allocator<char>::~allocator((allocator<char> *)&local_e59);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_cf0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cf1);
  std::__cxx11::string::~string(local_cc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cc9);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_ca0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ca1);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_b38);
  std::allocator<char>::~allocator((allocator<char> *)&local_b39);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_b10);
  std::allocator<char>::~allocator((allocator<char> *)&local_b11);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_9a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9a9);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_980);
  std::allocator<char>::~allocator((allocator<char> *)&local_981);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_818);
  std::allocator<char>::~allocator((allocator<char> *)&local_819);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_7f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7f1);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_688);
  std::allocator<char>::~allocator((allocator<char> *)&local_689);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_660);
  std::allocator<char>::~allocator((allocator<char> *)&local_661);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  (**(code **)*local_8)(local_8,local_1b8);
  required_length =
       getHasher((string *)CONCAT17(in_stack_ffffffffffffc56f,in_stack_ffffffffffffc568));
  plVar16 = local_8;
  *(hash_func_t *)(*(long *)&(local_10->super_base_option).m_name + 0x1f8) = required_length;
  err_msg = (string *)local_24d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_24d9 + 1),"spelling",(allocator *)err_msg);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_24d9 + 1);
  std::__cxx11::string::~string((string *)(local_24d9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_24d9);
  if ((bVar1 & 1) != 0) {
    for (local_24e8 = 0; uVar12 = local_24e8,
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_60), uVar12 < sVar4; local_24e8 = local_24e8 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_60,local_24e8);
      spoof_hex_encoded_namespaces
                ((string *)CONCAT17(in_stack_ffffffffffffc40f,in_stack_ffffffffffffc408));
      pvVar13 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&local_60,local_24e8);
      std::__cxx11::string::operator=((string *)pvVar13,local_2508);
      std::__cxx11::string::~string(local_2508);
      pvVar13 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&local_60,local_24e8);
      pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)pvVar13);
      ptVar18 = local_10;
      if (*pcVar11 == '_') {
        local_10[0x2b].super_base_option.m_help.field_2._M_local_buf[0] = '\x01';
      }
      else {
        pvVar13 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&local_60,local_24e8);
        pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)pvVar13);
        ptVar18[0x2b].super_base_option.m_name.field_2._M_local_buf[(long)*pcVar11 + 8] = '\x01';
      }
    }
  }
  plVar16 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2528,"affix",&local_2529);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_2528);
  std::__cxx11::string::~string(local_2528);
  std::allocator<char>::~allocator((allocator<char> *)&local_2529);
  if ((bVar1 & 1) != 0) {
    spoof_hex_encoded_namespaces
              ((string *)CONCAT17(in_stack_ffffffffffffc40f,in_stack_ffffffffffffc408));
    parse_affix_argument(all_00,str);
    std::__cxx11::string::~string(local_2550);
  }
  plVar16 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2570,"ngram",&local_2571);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_2570);
  std::__cxx11::string::~string(local_2570);
  std::allocator<char>::~allocator((allocator<char> *)&local_2571);
  plVar16 = local_8;
  if ((bVar1 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2598,"sort_features",&local_2599);
    bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_2598);
    std::__cxx11::string::~string(local_2598);
    std::allocator<char>::~allocator((allocator<char> *)&local_2599);
    iVar14 = (int)((ulong)in_stack_ffffffffffffc3c0 >> 0x20);
    if ((bVar1 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_2728);
      std::operator<<(&local_2718,"ngram is incompatible with sort_features.");
      local_2749 = 1;
      uVar8 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_ffffffffffffc3d0,in_stack_ffffffffffffc3c8,iVar14,
                 in_stack_ffffffffffffc3b8);
      local_2749 = 0;
      __cxa_throw(uVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    for (local_2758 = 0; uVar12 = local_2758,
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_10[10].m_location), uVar12 < sVar4; local_2758 = local_2758 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_10[10].m_location,local_2758);
      spoof_hex_encoded_namespaces
                ((string *)CONCAT17(in_stack_ffffffffffffc40f,in_stack_ffffffffffffc408));
      pvVar13 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_10[10].m_location,local_2758);
      std::__cxx11::string::operator=((string *)pvVar13,local_2778);
      std::__cxx11::string::~string(local_2778);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_ffffffffffffc3f7,
                         CONCAT16(in_stack_ffffffffffffc3f6,in_stack_ffffffffffffc3f0)),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffc3e8._M_current);
    compile_gram(in_stack_ffffffffffffc490,
                 (uint32_t *)CONCAT17(in_stack_ffffffffffffc48f,in_stack_ffffffffffffc488),
                 in_stack_ffffffffffffc480,SUB81((ulong)in_stack_ffffffffffffc478 >> 0x38,0));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffc3b0);
  }
  plVar16 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_27b0,"skips",&local_27b1);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_27b0);
  std::__cxx11::string::~string(local_27b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_27b1);
  plVar16 = local_8;
  if ((bVar1 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_27d8,"ngram",&local_27d9);
    bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_27d8);
    std::__cxx11::string::~string(local_27d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_27d9);
    iVar14 = (int)((ulong)in_stack_ffffffffffffc3c0 >> 0x20);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_2968);
      std::operator<<(&local_2958,"You can not skip unless ngram is > 1");
      local_2989 = 1;
      uVar8 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_ffffffffffffc3d0,in_stack_ffffffffffffc3c8,iVar14,
                 in_stack_ffffffffffffc3b8);
      local_2989 = 0;
      __cxa_throw(uVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_2998 = 0;
    while( true ) {
      uVar12 = local_2998;
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_10[10].m_default_value);
      uVar17 = (undefined1)((ulong)in_stack_ffffffffffffc478 >> 0x38);
      if (sVar4 <= uVar12) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_10[10].m_default_value,local_2998);
      spoof_hex_encoded_namespaces
                ((string *)CONCAT17(in_stack_ffffffffffffc40f,in_stack_ffffffffffffc408));
      pvVar13 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_10[10].m_default_value,local_2998);
      std::__cxx11::string::operator=((string *)pvVar13,local_29b8);
      std::__cxx11::string::~string(local_29b8);
      local_2998 = local_2998 + 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_ffffffffffffc3f7,
                         CONCAT16(in_stack_ffffffffffffc3f6,in_stack_ffffffffffffc3f0)),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffc3e8._M_current);
    compile_gram(in_stack_ffffffffffffc490,
                 (uint32_t *)CONCAT17(in_stack_ffffffffffffc48f,in_stack_ffffffffffffc488),
                 in_stack_ffffffffffffc480,(bool)uVar17);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffc3b0);
  }
  plVar16 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_29f0,"feature_limit",&local_29f1);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_29f0);
  std::__cxx11::string::~string(local_29f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_29f1);
  if ((bVar1 & 1) != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_ffffffffffffc3f7,
                         CONCAT16(in_stack_ffffffffffffc3f6,in_stack_ffffffffffffc3f0)),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffc3e8._M_current);
    compile_limits(in_stack_ffffffffffffc470,in_stack_ffffffffffffc468,
                   (bool)in_stack_ffffffffffffc467);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffc3b0);
  }
  plVar16 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a30,"bit_precision",&local_2a31);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_2a30);
  std::__cxx11::string::~string(local_2a30);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a31);
  iVar14 = (int)((ulong)in_stack_ffffffffffffc3c0 >> 0x20);
  if ((bVar1 & 1) != 0) {
    if ((((local_10->super_base_option).m_short_name.field_0x4 & 1) == 0) &&
       (local_48 != *(uint *)&(local_10->super_base_option).m_short_name)) {
      std::__cxx11::stringstream::stringstream(local_2bc0);
      poVar5 = std::operator<<(&local_2bb0,"Number of bits is set to ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_48);
      poVar5 = std::operator<<(poVar5," and ");
      poVar5 = (ostream *)
               std::ostream::operator<<(poVar5,*(uint *)&(local_10->super_base_option).m_short_name)
      ;
      std::operator<<(poVar5," by argument and model.  That does not work.");
      local_2be1 = 1;
      uVar8 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_ffffffffffffc3d0,in_stack_ffffffffffffc3c8,iVar14,
                 in_stack_ffffffffffffc3b8);
      local_2be1 = 0;
      __cxa_throw(uVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    (local_10->super_base_option).m_short_name.field_0x4 = 0;
    *(uint *)&(local_10->super_base_option).m_short_name = local_48;
    VW::validate_num_bits(in_stack_ffffffffffffc570);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12e21f);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffc3b0);
  local_2c22 = 0;
  local_2c23 = 0;
  local_2c4a = 0;
  local_2c4b = 0;
  local_2c72 = 0;
  local_2c73 = 0;
  if (((!bVar2) ||
      (bVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffc3b0), !bVar2)) ||
     (bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffc3b0), !bVar2)) {
    plVar16 = local_8;
    std::allocator<char>::allocator();
    local_2c22 = 1;
    std::__cxx11::string::string(local_2c20,"quadratic",&local_2c21);
    local_2c23 = 1;
    bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_2c20);
    plVar16 = local_8;
    local_39c2 = 1;
    if ((bVar1 & 1) != 0) goto LAB_0012e458;
    std::allocator<char>::allocator();
    local_2c4a = 1;
    std::__cxx11::string::string(local_2c48,"cubic",&local_2c49);
    local_2c4b = 1;
    bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_2c48);
    plVar16 = local_8;
    local_39c2 = 1;
    if ((bVar1 & 1) != 0) goto LAB_0012e458;
    std::allocator<char>::allocator();
    local_2c72 = 1;
    std::__cxx11::string::string(local_2c70,"interactions",&local_2c71);
    local_2c73 = 1;
    bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_2c70);
    local_39c2 = 1;
    if ((bVar1 & 1) != 0) goto LAB_0012e458;
  }
  local_39c2 = interactions_settings_doubled;
LAB_0012e458:
  if ((local_2c73 & 1) != 0) {
    std::__cxx11::string::~string(local_2c70);
  }
  if ((local_2c72 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_2c71);
  }
  if ((local_2c4b & 1) != 0) {
    std::__cxx11::string::~string(local_2c48);
  }
  if ((local_2c4a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_2c49);
  }
  if ((local_2c23 & 1) != 0) {
    std::__cxx11::string::~string(local_2c20);
  }
  if ((local_2c22 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_2c21);
  }
  if ((local_39c2 & 1) != 0) {
    poVar5 = std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                             "WARNING: model file has set of {-q, --cubic, --interactions} settings stored, but they\'ll be OVERRIDEN by set of {-q, --cubic, --interactions} settings from command line."
                            );
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffc3b0);
    if (!bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x12e577);
    }
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffc3b0);
    if (!bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x12e6f1);
    }
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffc3b0);
    if (!bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x12e71d);
    }
  }
  plVar16 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c98,"quadratic",&local_2c99);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_2c98);
  std::__cxx11::string::~string(local_2c98);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c99);
  if ((bVar1 & 1) != 0) {
    if ((local_10[0x53].super_base_option.m_short_name._M_string_length & 0x100) == 0) {
      std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                      "creating quadratic features for pairs: ");
    }
    local_2ca8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffc398);
    while( true ) {
      local_2cb0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffc398);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffc3a0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffc398);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_2ca8);
      spoof_hex_encoded_namespaces
                ((string *)CONCAT17(in_stack_ffffffffffffc40f,in_stack_ffffffffffffc408));
      pbVar10 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_2ca8);
      std::__cxx11::string::operator=((string *)pbVar10,local_2cd0);
      std::__cxx11::string::~string(local_2cd0);
      if ((local_10[0x53].super_base_option.m_short_name._M_string_length & 0x100) == 0) {
        ptVar18 = local_10 + 1;
        pbVar10 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_2ca8);
        poVar5 = std::operator<<((ostream *)&(ptVar18->super_base_option).m_help.field_2,
                                 (string *)pbVar10);
        std::operator<<(poVar5," ");
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_2ca8);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_2d08,"error, quadratic features must involve two sets.",&local_2d09);
    INTERACTIONS::expand_interactions
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ptVar3,(size_t)required_length,err_msg);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffc3b0,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffc3a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffc3b0);
    std::__cxx11::string::~string(local_2d08);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d09);
    if ((local_10[0x53].super_base_option.m_short_name._M_string_length & 0x100) == 0) {
      std::ostream::operator<<
                (&local_10[1].super_base_option.m_help.field_2,
                 std::endl<char,std::char_traits<char>>);
    }
  }
  plVar16 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d30,"cubic",&local_2d31);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_2d30);
  std::__cxx11::string::~string(local_2d30);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d31);
  if ((bVar1 & 1) != 0) {
    if ((local_10[0x53].super_base_option.m_short_name._M_string_length & 0x100) == 0) {
      std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                      "creating cubic features for triples: ");
    }
    local_2d40._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffc398);
    while( true ) {
      local_2d48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffc398);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffc3a0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffc398);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_2d40);
      spoof_hex_encoded_namespaces
                ((string *)CONCAT17(in_stack_ffffffffffffc40f,in_stack_ffffffffffffc408));
      pbVar10 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_2d40);
      std::__cxx11::string::operator=((string *)pbVar10,local_2d68);
      std::__cxx11::string::~string(local_2d68);
      if ((local_10[0x53].super_base_option.m_short_name._M_string_length & 0x100) == 0) {
        ptVar18 = local_10 + 1;
        pbVar10 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_2d40);
        poVar5 = std::operator<<((ostream *)&(ptVar18->super_base_option).m_help.field_2,
                                 (string *)pbVar10);
        std::operator<<(poVar5," ");
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_2d40);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_2da0,"error, cubic features must involve three sets.",&local_2da1);
    INTERACTIONS::expand_interactions
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ptVar3,(size_t)required_length,err_msg);
    std::__cxx11::string::~string(local_2da0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2da1);
    local_2db8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                           ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_ffffffffffffc398);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffc3a0,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffc398);
    local_2dc0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                           ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_ffffffffffffc398);
    local_2dc8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                           ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_ffffffffffffc398);
    __first._M_current._6_1_ = in_stack_ffffffffffffc3f6;
    __first._M_current._0_6_ = in_stack_ffffffffffffc3f0;
    __first._M_current._7_1_ = in_stack_ffffffffffffc3f7;
    local_2dd0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                 insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                           ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)CONCAT17(in_stack_ffffffffffffc3e7,in_stack_ffffffffffffc3e0),
                            in_stack_ffffffffffffc3f8,__first,in_stack_ffffffffffffc3e8);
    if ((local_10[0x53].super_base_option.m_short_name._M_string_length & 0x100) == 0) {
      std::ostream::operator<<
                (&local_10[1].super_base_option.m_help.field_2,
                 std::endl<char,std::char_traits<char>>);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffc3b0);
  }
  plVar16 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2df0,"interactions",&local_2df1);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_2df0);
  std::__cxx11::string::~string(local_2df0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2df1);
  uVar17 = (undefined1)((ulong)in_stack_ffffffffffffc528 >> 0x38);
  if ((bVar1 & 1) != 0) {
    if ((local_10[0x53].super_base_option.m_short_name._M_string_length & 0x100) == 0) {
      std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                      "creating features for following interactions: ");
    }
    local_2e00._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffc398);
    while( true ) {
      local_2e08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffc398);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffc3a0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffc398);
      uVar17 = (undefined1)((ulong)in_stack_ffffffffffffc528 >> 0x38);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_2e00);
      spoof_hex_encoded_namespaces
                ((string *)CONCAT17(in_stack_ffffffffffffc40f,in_stack_ffffffffffffc408));
      pbVar10 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_2e00);
      std::__cxx11::string::operator=((string *)pbVar10,local_2e28);
      std::__cxx11::string::~string(local_2e28);
      if ((local_10[0x53].super_base_option.m_short_name._M_string_length & 0x100) == 0) {
        ptVar18 = local_10 + 1;
        pbVar10 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_2e00);
        poVar5 = std::operator<<((ostream *)&(ptVar18->super_base_option).m_help.field_2,
                                 (string *)pbVar10);
        std::operator<<(poVar5," ");
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_2e00);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2e60,"",&local_2e61);
    INTERACTIONS::expand_interactions
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ptVar3,(size_t)required_length,err_msg);
    std::__cxx11::string::~string(local_2e60);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e61);
    local_2e78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                           ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_ffffffffffffc398);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffc3a0,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffc398);
    local_2e80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                           ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_ffffffffffffc398);
    local_2e88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                           ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_ffffffffffffc398);
    __first_00._M_current._6_1_ = in_stack_ffffffffffffc3f6;
    __first_00._M_current._0_6_ = in_stack_ffffffffffffc3f0;
    __first_00._M_current._7_1_ = in_stack_ffffffffffffc3f7;
    in_stack_ffffffffffffc530 =
         std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
         insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(in_stack_ffffffffffffc3e7,in_stack_ffffffffffffc3e0),
                    in_stack_ffffffffffffc3f8,__first_00,in_stack_ffffffffffffc3e8);
    local_2e90 = in_stack_ffffffffffffc530._M_current;
    if ((local_10[0x53].super_base_option.m_short_name._M_string_length & 0x100) == 0) {
      std::ostream::operator<<
                (&local_10[1].super_base_option.m_help.field_2,
                 std::endl<char,std::char_traits<char>>);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffc3b0);
  }
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_2c00);
  if (sVar4 != 0) {
    INTERACTIONS::sort_and_filter_duplicate_interactions
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffc530._M_current,(bool)uVar17,in_stack_ffffffffffffc520,
               in_stack_ffffffffffffc518);
    if (local_2e98 != 0) {
      poVar5 = std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                               "WARNING: duplicate namespace interactions were found. Removed: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_2e98);
      poVar5 = std::operator<<(poVar5,'.');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,
                               "You can use --leave_duplicate_interactions to disable this behaviour."
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    if (local_2ea0 != 0) {
      poVar5 = std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                               "WARNING: some interactions contain duplicate characters and their characters order has been changed. Interactions affected: "
                              );
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_2ea0);
      poVar5 = std::operator<<(poVar5,'.');
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&local_10[5].super_base_option.m_help.field_2 + 8));
    if (sVar4 != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x12f3f2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(in_stack_ffffffffffffc440,in_stack_ffffffffffffc438);
    local_2ea8 = &local_2c00;
    local_2eb0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffc398);
    local_2eb8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffc398);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffc3a0,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffc398), bVar2) {
      local_2ec0 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_2eb0);
      local_2ec8 = std::__cxx11::string::size();
      if (local_2ec8 == 2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
      }
      else if (local_2ec8 == 3) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_2eb0);
    }
  }
  plVar16 = local_8;
  for (local_2ed0 = 0; local_2ed0 < 0x100; local_2ed0 = local_2ed0 + 1) {
    *(undefined1 *)
     ((long)&local_10[5].m_default_value.
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr + local_2ed0 + 1) = 0;
    (&local_10[7].super_base_option.m_short_name.field_0x2)[local_2ed0] = 0;
  }
  *(undefined1 *)
   &local_10[5].m_default_value.
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = 0;
  local_10[7].super_base_option.m_short_name.field_0x1 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2ef0,"ignore",&local_2ef1);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_2ef0);
  std::__cxx11::string::~string(local_2ef0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2ef1);
  if ((bVar1 & 1) != 0) {
    *(undefined1 *)
     &local_10[5].m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = 1;
    local_2f00._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffc398);
    while( true ) {
      local_2f08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffc398);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffc3a0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffc398);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_2f00);
      spoof_hex_encoded_namespaces
                ((string *)CONCAT17(in_stack_ffffffffffffc40f,in_stack_ffffffffffffc408));
      pbVar10 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_2f00);
      std::__cxx11::string::operator=((string *)pbVar10,local_2f28);
      std::__cxx11::string::~string(local_2f28);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_2f00);
      local_2f38 = std::__cxx11::string::begin();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffc3a0,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffc398);
      while( true ) {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_2f00);
        local_2f40 = std::__cxx11::string::end();
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_ffffffffffffc3a0,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_ffffffffffffc398);
        ptVar18 = local_10;
        if (!bVar2) break;
        pbVar9 = (byte *)__gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&local_2f30);
        *(undefined1 *)
         ((long)&ptVar18[5].m_default_value.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr + (ulong)*pbVar9 + 1) = 1;
        local_2f48 = (char *)__gnu_cxx::
                             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)in_stack_ffffffffffffc3a8,
                                          (int)((ulong)in_stack_ffffffffffffc3a0 >> 0x20));
      }
      local_2f50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffc3a8,
                                (int)((ulong)in_stack_ffffffffffffc3a0 >> 0x20));
    }
    if ((local_10[0x53].super_base_option.m_short_name._M_string_length & 0x100) == 0) {
      std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                      "ignoring namespaces beginning with: ");
      local_2f58 = local_c0;
      local_2f60._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffc398);
      local_2f68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffc398);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffc3a0,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffc398), bVar2) {
        local_2f78 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_2f60);
        local_2f70 = local_2f78;
        local_2f80._M_current = (char *)std::__cxx11::string::begin();
        local_2f88 = std::__cxx11::string::end();
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)in_stack_ffffffffffffc3a0,
                                  (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)in_stack_ffffffffffffc398), bVar2) {
          pcVar6 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_2f80);
          local_2f89 = *pcVar6;
          poVar5 = std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                                   local_2f89);
          std::operator<<(poVar5," ");
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_2f80);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_2f60);
      }
      std::ostream::operator<<
                (&local_10[1].super_base_option.m_help.field_2,
                 std::endl<char,std::char_traits<char>>);
    }
  }
  plVar16 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2fb0,"ignore_linear",&local_2fb1);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_2fb0);
  std::__cxx11::string::~string(local_2fb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2fb1);
  if ((bVar1 & 1) != 0) {
    local_10[7].super_base_option.m_short_name.field_0x1 = 1;
    local_2fc0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffc398);
    while( true ) {
      local_2fc8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffc398);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffc3a0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffc398);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_2fc0);
      spoof_hex_encoded_namespaces
                ((string *)CONCAT17(in_stack_ffffffffffffc40f,in_stack_ffffffffffffc408));
      pbVar10 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_2fc0);
      std::__cxx11::string::operator=((string *)pbVar10,local_2fe8);
      std::__cxx11::string::~string(local_2fe8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_2fc0);
      local_2ff8 = std::__cxx11::string::begin();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffc3a0,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffc398);
      while( true ) {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_2fc0);
        local_3000 = std::__cxx11::string::end();
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_ffffffffffffc3a0,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_ffffffffffffc398);
        ptVar18 = local_10;
        if (!bVar2) break;
        pbVar9 = (byte *)__gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&local_2ff0);
        (&ptVar18[7].super_base_option.m_short_name.field_0x2)[*pbVar9] = 1;
        local_3008 = (char *)__gnu_cxx::
                             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)in_stack_ffffffffffffc3a8,
                                          (int)((ulong)in_stack_ffffffffffffc3a0 >> 0x20));
      }
      local_3010 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffc3a8,
                                (int)((ulong)in_stack_ffffffffffffc3a0 >> 0x20));
    }
    if ((local_10[0x53].super_base_option.m_short_name._M_string_length & 0x100) == 0) {
      std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                      "ignoring linear terms for namespaces beginning with: ");
      local_3018 = local_d8;
      local_3020._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffc398);
      local_3028 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffc398);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffc3a0,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffc398), bVar2) {
        local_3038 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_3020);
        local_3030 = local_3038;
        local_3040._M_current = (char *)std::__cxx11::string::begin();
        local_3048 = std::__cxx11::string::end();
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)in_stack_ffffffffffffc3a0,
                                  (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)in_stack_ffffffffffffc398), bVar2) {
          pcVar6 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_3040);
          local_3049 = *pcVar6;
          poVar5 = std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                                   local_3049);
          std::operator<<(poVar5," ");
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_3040);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_3020);
      }
      std::ostream::operator<<
                (&local_10[1].super_base_option.m_help.field_2,
                 std::endl<char,std::char_traits<char>>);
    }
  }
  plVar16 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3070,"keep",&local_3071);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_3070);
  std::__cxx11::string::~string(local_3070);
  std::allocator<char>::~allocator((allocator<char> *)&local_3071);
  if ((bVar1 & 1) != 0) {
    for (local_3080 = 0; local_3080 < 0x100; local_3080 = local_3080 + 1) {
      *(undefined1 *)
       ((long)&local_10[5].m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr + local_3080 + 1) = 1;
    }
    *(undefined1 *)
     &local_10[5].m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = 1;
    local_3088._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffc398);
    while( true ) {
      local_3090 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffc398);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffc3a0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffc398);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_3088);
      spoof_hex_encoded_namespaces
                ((string *)CONCAT17(in_stack_ffffffffffffc40f,in_stack_ffffffffffffc408));
      pbVar10 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_3088);
      std::__cxx11::string::operator=((string *)pbVar10,local_30b0);
      std::__cxx11::string::~string(local_30b0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_3088);
      local_30c0 = std::__cxx11::string::begin();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffc3a0,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffc398);
      while( true ) {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_3088);
        local_30c8 = std::__cxx11::string::end();
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_ffffffffffffc3a0,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_ffffffffffffc398);
        if (!bVar2) break;
        ptVar18 = local_10;
        pbVar9 = (byte *)__gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&local_30b8);
        *(undefined1 *)
         ((long)&ptVar18[5].m_default_value.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr + (ulong)*pbVar9 + 1) = 0;
        local_30d0 = (char *)__gnu_cxx::
                             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)in_stack_ffffffffffffc3a8,
                                          (int)((ulong)in_stack_ffffffffffffc3a0 >> 0x20));
      }
      local_30d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffc3a8,
                                (int)((ulong)in_stack_ffffffffffffc3a0 >> 0x20));
    }
    if ((local_10[0x53].super_base_option.m_short_name._M_string_length & 0x100) == 0) {
      std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                      "using namespaces beginning with: ");
      local_30e0 = local_f0;
      local_30e8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffc398);
      local_30f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffc398);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffc3a0,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffc398), bVar2) {
        local_3100 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_30e8);
        local_30f8 = local_3100;
        local_3108._M_current = (char *)std::__cxx11::string::begin();
        local_3110 = std::__cxx11::string::end();
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)in_stack_ffffffffffffc3a0,
                                  (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)in_stack_ffffffffffffc398), bVar2) {
          pcVar6 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_3108);
          local_3111 = *pcVar6;
          poVar5 = std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                                   local_3111);
          std::operator<<(poVar5," ");
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_3108);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_30e8);
      }
      std::ostream::operator<<
                (&local_10[1].super_base_option.m_help.field_2,
                 std::endl<char,std::char_traits<char>>);
    }
  }
  *(undefined1 *)((long)&local_10[9].super_base_option.m_name._M_string_length + 2) = 0;
  paVar15 = &local_3139;
  plVar16 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3138,"redefine",paVar15);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_3138);
  std::__cxx11::string::~string(local_3138);
  std::allocator<char>::~allocator((allocator<char> *)&local_3139);
  if ((bVar1 & 1) != 0) {
    for (local_3148 = 0; local_3148 < 0x100; local_3148 = local_3148 + 1) {
      *(char *)((long)&local_10[9].super_base_option.m_name._M_string_length + local_3148 + 3) =
           (char)local_3148;
    }
    local_3150._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffc398);
    while( true ) {
      local_3158 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffc398);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffc3a0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffc398);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_3150);
      spoof_hex_encoded_namespaces
                ((string *)CONCAT17(in_stack_ffffffffffffc40f,in_stack_ffffffffffffc408));
      uVar12 = std::__cxx11::string::length();
      local_3188 = 0;
      bVar2 = false;
      local_318a = ' ';
      for (local_3198 = 0; local_3198 < uVar12; local_3198 = local_3198 + 1) {
        if (bVar2) {
          if (2 < local_3198) {
            puVar7 = (uchar *)std::__cxx11::string::operator[]((ulong)local_3178);
            local_318a = *puVar7;
          }
          break;
        }
        pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)local_3178);
        if (*pcVar11 == ':') {
          local_3188 = local_3198 + 1;
        }
        else {
          pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)local_3178);
          if ((*pcVar11 == '=') && (local_3188 == local_3198)) {
            bVar2 = true;
          }
        }
      }
      iVar14 = (int)((ulong)in_stack_ffffffffffffc3c0 >> 0x20);
      if (!bVar2) {
        std::__cxx11::stringstream::stringstream(local_3320);
        std::operator<<((ostream *)(local_3320 + 0x10),
                        "argument of --redefine is malformed. Valid format is N:=S, :=S or N:=");
        local_3341 = 1;
        uVar8 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  (in_stack_ffffffffffffc3d0,in_stack_ffffffffffffc3c8,iVar14,
                   in_stack_ffffffffffffc3b8);
        local_3341 = 0;
        __cxa_throw(uVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      local_3188 = local_3188 + 1;
      if (3 < local_3188) {
        poVar5 = std::operator<<((ostream *)&local_10[1].super_base_option.m_help.field_2,
                                 "WARNING: multiple namespaces are used in target part of --redefine argument. Only first one (\'"
                                );
        poVar5 = std::operator<<(poVar5,local_318a);
        in_stack_ffffffffffffc428 =
             (string *)std::operator<<(poVar5,"\') will be used as target namespace.");
        std::ostream::operator<<(in_stack_ffffffffffffc428,std::endl<char,std::char_traits<char>>);
      }
      *(undefined1 *)((long)&local_10[9].super_base_option.m_name._M_string_length + 2) = 1;
      if (local_3188 != uVar12) {
LAB_00130669:
        local_3350 = local_3188;
        if (local_3350 < uVar12) {
          pbVar9 = (byte *)std::__cxx11::string::operator[]((ulong)local_3178);
          local_3351 = *pbVar9;
          if (local_3351 != 0x3a) goto code_r0x001306bc;
          for (local_3360 = 0; local_3360 < 0x100; local_3360 = local_3360 + 1) {
            *(uchar *)((long)&local_10[9].super_base_option.m_name._M_string_length + local_3360 + 3
                      ) = local_318a;
          }
        }
        goto LAB_00130749;
      }
      local_10[9].super_base_option.m_help.field_0x3 = local_318a;
LAB_00130749:
      std::__cxx11::string::~string(local_3178);
      local_3368 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffc3a8,
                                (int)((ulong)in_stack_ffffffffffffc3a0 >> 0x20));
    }
  }
  plVar16 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3388,"dictionary",&local_3389);
  bVar1 = (**(code **)(*plVar16 + 8))(plVar16,local_3388);
  std::__cxx11::string::~string(local_3388);
  std::allocator<char>::~allocator((allocator<char> *)&local_3389);
  if ((bVar1 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_33b0,"dictionary_path",&local_33b1);
    bVar1 = (**(code **)(*local_8 + 8))(local_8,local_33b0);
    std::__cxx11::string::~string(local_33b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_33b1);
    if ((bVar1 & 1) != 0) {
      local_33c0 = local_138;
      local_33c8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffc398);
      local_33d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffc398);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffc3a0,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffc398), bVar2) {
        pbVar10 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_33c8);
        std::__cxx11::string::string(local_33f0,(string *)pbVar10);
        std::__cxx11::string::string(local_3410,local_33f0);
        bVar1 = directory_exists(in_stack_ffffffffffffc428);
        std::__cxx11::string::~string(local_3410);
        if ((bVar1 & 1) != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffc3b0,in_stack_ffffffffffffc3a8);
        }
        std::__cxx11::string::~string(local_33f0);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_33c8);
      }
    }
    paVar15 = &local_3431;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3430,".",paVar15);
    bVar1 = directory_exists(in_stack_ffffffffffffc428);
    std::__cxx11::string::~string(local_3430);
    std::allocator<char>::~allocator((allocator<char> *)&local_3431);
    if ((bVar1 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3458,".",&local_3459);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffc3a0,(value_type *)in_stack_ffffffffffffc398);
      std::__cxx11::string::~string(local_3458);
      std::allocator<char>::~allocator((allocator<char> *)&local_3459);
    }
    pcVar11 = getenv("PATH");
    paVar15 = &local_3481;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3480,pcVar11,paVar15);
    std::allocator<char>::~allocator((allocator<char> *)&local_3481);
    local_3482 = 0x3a;
    uVar12 = std::__cxx11::string::empty();
    if ((uVar12 & 1) == 0) {
      local_3490 = 0;
      local_3498 = std::__cxx11::string::find((char)local_3480,0x3a);
      while (local_3498 != -1) {
        std::__cxx11::string::substr((ulong)local_34b8,(ulong)local_3480);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffc3a0,(value_type *)in_stack_ffffffffffffc398);
        std::__cxx11::string::~string(local_34b8);
        local_3490 = local_3498 + 1;
        local_3498 = std::__cxx11::string::find((char)local_3480,0x3a);
      }
      in_stack_ffffffffffffc3b0 = (typed_option<unsigned_int> *)&local_10[0x2c].m_value;
      std::__cxx11::string::substr((ulong)local_34d8,(ulong)local_3480);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffc3a0,(value_type *)in_stack_ffffffffffffc398);
      std::__cxx11::string::~string(local_34d8);
    }
    local_34e0 = 0;
    while (uVar12 = local_34e0,
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(local_120), uVar12 < sVar4) {
      in_stack_ffffffffffffc3a0 = local_10;
      pvVar13 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](local_120,local_34e0);
      std::__cxx11::string::string(local_3500,(string *)pvVar13);
      parse_dictionary_argument(in_stack_ffffffffffffcde0,in_stack_ffffffffffffcdd8);
      std::__cxx11::string::~string(local_3500);
      local_34e0 = local_34e0 + 1;
    }
    std::__cxx11::string::~string(local_3480);
  }
  if ((local_139 & 1) != 0) {
    local_10[0x53].super_base_option.field_0x74 = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffc3b0);
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffc3a0);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string(local_160);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffc3b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffc3b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffc3b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffc3b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffc3b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffc3b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffc3b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffc3b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffc3b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffc3b0);
  std::__cxx11::string::~string(local_30);
  return;
code_r0x001306bc:
  *(uchar *)((long)&local_10[9].super_base_option.m_name._M_string_length + (ulong)local_3351 + 3) =
       local_318a;
  local_3188 = local_3350 + 1;
  goto LAB_00130669;
}

Assistant:

void parse_feature_tweaks(options_i& options, vw& all)
{
  string hash_function("strings");
  uint32_t new_bits;
  vector<string> spelling_ns;
  vector<string> quadratics;
  vector<string> cubics;
  vector<string> interactions;
  vector<string> ignores;
  vector<string> ignore_linears;
  vector<string> keeps;
  vector<string> redefines;
  vector<string> dictionary_nses;

  vector<string> dictionary_path;

  bool noconstant;
  bool leave_duplicate_interactions;
  std::string affix;
  std::string q_colon;

  option_group_definition feature_options("Feature options");
  feature_options
      .add(make_option("hash", hash_function).keep().help("how to hash the features. Available options: strings, all"))
      .add(make_option("hash_seed", all.hash_seed).keep().default_value(0).help("seed for hash function"))
      .add(make_option("ignore", ignores).keep().help("ignore namespaces beginning with character <arg>"))
      .add(make_option("ignore_linear", ignore_linears)
               .keep()
               .help("ignore namespaces beginning with character <arg> for linear terms only"))
      .add(make_option("keep", keeps).keep().help("keep namespaces beginning with character <arg>"))
      .add(make_option("redefine", redefines)
               .keep()
               .help("redefine namespaces beginning with characters of string S as namespace N. <arg> shall be in form "
                     "'N:=S' where := is operator. Empty N or S are treated as default namespace. Use ':' as a "
                     "wildcard in S.")
               .keep())
      .add(make_option("bit_precision", new_bits).short_name("b").help("number of bits in the feature table"))
      .add(make_option("noconstant", noconstant).help("Don't add a constant feature"))
      .add(make_option("constant", all.initial_constant).short_name("C").help("Set initial value of constant"))
      .add(make_option("ngram", all.ngram_strings)
               .help("Generate N grams. To generate N grams for a single namespace 'foo', arg should be fN."))
      .add(make_option("skips", all.skip_strings)
               .help("Generate skips in N grams. This in conjunction with the ngram tag can be used to generate "
                     "generalized n-skip-k-gram. To generate n-skips for a single namespace 'foo', arg should be fN."))
      .add(make_option("feature_limit", all.limit_strings)
               .help("limit to N features. To apply to a single namespace 'foo', arg should be fN"))
      .add(make_option("affix", affix)
               .keep()
               .help("generate prefixes/suffixes of features; argument '+2a,-3b,+1' means generate 2-char prefixes for "
                     "namespace a, 3-char suffixes for b and 1 char prefixes for default namespace"))
      .add(make_option("spelling", spelling_ns)
               .keep()
               .help("compute spelling features for a give namespace (use '_' for default namespace)"))
      .add(make_option("dictionary", dictionary_nses)
               .keep()
               .help("read a dictionary for additional features (arg either 'x:file' or just 'file')"))
      .add(make_option("dictionary_path", dictionary_path)
               .help("look in this directory for dictionaries; defaults to current directory or env{PATH}"))
      .add(make_option("interactions", interactions)
               .keep()
               .help("Create feature interactions of any level between namespaces."))
      .add(make_option("permutations", all.permutations)
               .help("Use permutations instead of combinations for feature interactions of same namespace."))
      .add(make_option("leave_duplicate_interactions", leave_duplicate_interactions)
               .help("Don't remove interactions with duplicate combinations of namespaces. For ex. this is a "
                     "duplicate: '-q ab -q ba' and a lot more in '-q ::'."))
      .add(make_option("quadratic", quadratics).short_name("q").keep().help("Create and use quadratic features"))
      // TODO this option is unused - remove?
      .add(make_option("q:", q_colon).help(": corresponds to a wildcard for all printable characters"))
      .add(make_option("cubic", cubics).keep().help("Create and use cubic features"));
  options.add_and_parse(feature_options);

  // feature manipulation
  all.p->hasher = getHasher(hash_function);

  if (options.was_supplied("spelling"))
  {
    for (size_t id = 0; id < spelling_ns.size(); id++)
    {
      spelling_ns[id] = spoof_hex_encoded_namespaces(spelling_ns[id]);
      if (spelling_ns[id][0] == '_')
        all.spelling_features[(unsigned char)' '] = true;
      else
        all.spelling_features[(size_t)spelling_ns[id][0]] = true;
    }
  }

  if (options.was_supplied("affix"))
    parse_affix_argument(all, spoof_hex_encoded_namespaces(affix));

  if (options.was_supplied("ngram"))
  {
    if (options.was_supplied("sort_features"))
      THROW("ngram is incompatible with sort_features.");

    for (size_t i = 0; i < all.ngram_strings.size(); i++)
      all.ngram_strings[i] = spoof_hex_encoded_namespaces(all.ngram_strings[i]);
    compile_gram(all.ngram_strings, all.ngram, (char*)"grams", all.quiet);
  }

  if (options.was_supplied("skips"))
  {
    if (!options.was_supplied("ngram"))
      THROW("You can not skip unless ngram is > 1");

    for (size_t i = 0; i < all.skip_strings.size(); i++)
      all.skip_strings[i] = spoof_hex_encoded_namespaces(all.skip_strings[i]);
    compile_gram(all.skip_strings, all.skips, (char*)"skips", all.quiet);
  }

  if (options.was_supplied("feature_limit"))
    compile_limits(all.limit_strings, all.limit, all.quiet);

  if (options.was_supplied("bit_precision"))
  {
    if (all.default_bits == false && new_bits != all.num_bits)
      THROW("Number of bits is set to " << new_bits << " and " << all.num_bits
                                        << " by argument and model.  That does not work.");

    all.default_bits = false;
    all.num_bits = new_bits;

    VW::validate_num_bits(all);
  }

  // prepare namespace interactions
  std::vector<std::string> expanded_interactions;

  if ( ( ((!all.pairs.empty() || !all.triples.empty() || !all.interactions.empty()) && /*data was restored from old model file directly to v_array and will be overriden automatically*/
          (options.was_supplied("quadratic") || options.was_supplied("cubic") || options.was_supplied("interactions")) ) )
       ||
       interactions_settings_doubled /*settings were restored from model file to file_options and overriden by params from command line*/)
  {
    all.trace_message << "WARNING: model file has set of {-q, --cubic, --interactions} settings stored, but they'll be "
                         "OVERRIDEN by set of {-q, --cubic, --interactions} settings from command line."
                      << endl;

    // in case arrays were already filled in with values from old model file - reset them
    if (!all.pairs.empty())
      all.pairs.clear();
    if (!all.triples.empty())
      all.triples.clear();
    if (!all.interactions.empty())
      all.interactions.clear();
  }

  if (options.was_supplied("quadratic"))
  {
    if (!all.quiet)
      all.trace_message << "creating quadratic features for pairs: ";

    for (vector<string>::iterator i = quadratics.begin(); i != quadratics.end(); ++i)
    {
      *i = spoof_hex_encoded_namespaces(*i);
      if (!all.quiet)
        all.trace_message << *i << " ";
    }

    expanded_interactions =
        INTERACTIONS::expand_interactions(quadratics, 2, "error, quadratic features must involve two sets.");

    if (!all.quiet)
      all.trace_message << endl;
  }

  if (options.was_supplied("cubic"))
  {
    if (!all.quiet)
      all.trace_message << "creating cubic features for triples: ";
    for (vector<string>::iterator i = cubics.begin(); i != cubics.end(); ++i)
    {
      *i = spoof_hex_encoded_namespaces(*i);
      if (!all.quiet)
        all.trace_message << *i << " ";
    }

    std::vector<std::string> exp_cubic =
        INTERACTIONS::expand_interactions(cubics, 3, "error, cubic features must involve three sets.");
    expanded_interactions.insert(std::begin(expanded_interactions), std::begin(exp_cubic), std::end(exp_cubic));

    if (!all.quiet)
      all.trace_message << endl;
  }

  if (options.was_supplied("interactions"))
  {
    if (!all.quiet)
      all.trace_message << "creating features for following interactions: ";
    for (vector<string>::iterator i = interactions.begin(); i != interactions.end(); ++i)
    {
      *i = spoof_hex_encoded_namespaces(*i);
      if (!all.quiet)
        all.trace_message << *i << " ";
    }

    std::vector<std::string> exp_inter = INTERACTIONS::expand_interactions(interactions, 0, "");
    expanded_interactions.insert(std::begin(expanded_interactions), std::begin(exp_inter), std::end(exp_inter));

    if (!all.quiet)
      all.trace_message << endl;
  }

  if (expanded_interactions.size() > 0)
  {
    size_t removed_cnt;
    size_t sorted_cnt;
    INTERACTIONS::sort_and_filter_duplicate_interactions(
        expanded_interactions, !leave_duplicate_interactions, removed_cnt, sorted_cnt);

    if (removed_cnt > 0)
      all.trace_message << "WARNING: duplicate namespace interactions were found. Removed: " << removed_cnt << '.'
                        << endl
                        << "You can use --leave_duplicate_interactions to disable this behaviour." << endl;
    if (sorted_cnt > 0)
      all.trace_message << "WARNING: some interactions contain duplicate characters and their characters order has "
                           "been changed. Interactions affected: "
                        << sorted_cnt << '.' << endl;

    if (all.interactions.size() > 0)
    {
      // should be empty, but just in case...
      all.interactions.clear();
    }

    all.interactions = expanded_interactions;

    // copy interactions of size 2 and 3 to old vectors for backward compatibility
    for (auto& i : expanded_interactions)
    {
      const size_t len = i.size();
      if (len == 2)
        all.pairs.push_back(i);
      else if (len == 3)
        all.triples.push_back(i);
    }
  }

  for (size_t i = 0; i < 256; i++)
  {
    all.ignore[i] = false;
    all.ignore_linear[i] = false;
  }
  all.ignore_some = false;
  all.ignore_some_linear = false;

  if (options.was_supplied("ignore"))
  {
    all.ignore_some = true;

    for (vector<string>::iterator i = ignores.begin(); i != ignores.end(); i++)
    {
      *i = spoof_hex_encoded_namespaces(*i);
      for (string::const_iterator j = i->begin(); j != i->end(); j++) all.ignore[(size_t)(unsigned char)*j] = true;
    }

    if (!all.quiet)
    {
      all.trace_message << "ignoring namespaces beginning with: ";
      for (auto const& ignore : ignores)
        for (auto const character : ignore) all.trace_message << character << " ";

      all.trace_message << endl;
    }
  }

  if (options.was_supplied("ignore_linear"))
  {
    all.ignore_some_linear = true;

    for (vector<string>::iterator i = ignore_linears.begin(); i != ignore_linears.end(); i++)
    {
      *i = spoof_hex_encoded_namespaces(*i);
      for (string::const_iterator j = i->begin(); j != i->end(); j++)
        all.ignore_linear[(size_t)(unsigned char)*j] = true;
    }

    if (!all.quiet)
    {
      all.trace_message << "ignoring linear terms for namespaces beginning with: ";
      for (auto const& ignore : ignore_linears)
        for (auto const character : ignore) all.trace_message << character << " ";

      all.trace_message << endl;
    }
  }

  if (options.was_supplied("keep"))
  {
    for (size_t i = 0; i < 256; i++) all.ignore[i] = true;

    all.ignore_some = true;

    for (vector<string>::iterator i = keeps.begin(); i != keeps.end(); i++)
    {
      *i = spoof_hex_encoded_namespaces(*i);
      for (string::const_iterator j = i->begin(); j != i->end(); j++) all.ignore[(size_t)(unsigned char)*j] = false;
    }

    if (!all.quiet)
    {
      all.trace_message << "using namespaces beginning with: ";
      for (auto const& keep : keeps)
        for (auto const character : keep) all.trace_message << character << " ";

      all.trace_message << endl;
    }
  }

  // --redefine param code
  all.redefine_some = false;  // false by default

  if (options.was_supplied("redefine"))
  {
    // initail values: i-th namespace is redefined to i itself
    for (size_t i = 0; i < 256; i++) all.redefine[i] = (unsigned char)i;

    // note: --redefine declaration order is matter
    // so --redefine :=L --redefine ab:=M  --ignore L  will ignore all except a and b under new M namspace

    for (vector<string>::iterator arg_iter = redefines.begin(); arg_iter != redefines.end(); arg_iter++)
    {
      string argument = spoof_hex_encoded_namespaces(*arg_iter);
      size_t arg_len = argument.length();

      size_t operator_pos = 0;  // keeps operator pos + 1 to stay unsigned type
      bool operator_found = false;
      unsigned char new_namespace = ' ';

      // let's find operator ':=' position in N:=S
      for (size_t i = 0; i < arg_len; i++)
      {
        if (operator_found)
        {
          if (i > 2)
          {
            new_namespace = argument[0];
          }  // N is not empty
          break;
        }
        else if (argument[i] == ':')
          operator_pos = i + 1;
        else if ((argument[i] == '=') && (operator_pos == i))
          operator_found = true;
      }

      if (!operator_found)
        THROW("argument of --redefine is malformed. Valid format is N:=S, :=S or N:=");

      if (++operator_pos > 3)  // seek operator end
        all.trace_message
            << "WARNING: multiple namespaces are used in target part of --redefine argument. Only first one ('"
            << new_namespace << "') will be used as target namespace." << endl;

      all.redefine_some = true;

      // case ':=S' doesn't require any additional code as new_namespace = ' ' by default

      if (operator_pos == arg_len)  // S is empty, default namespace shall be used
        all.redefine[(int)' '] = new_namespace;
      else
        for (size_t i = operator_pos; i < arg_len; i++)
        {
          // all namespaces from S are redefined to N
          unsigned char c = argument[i];
          if (c != ':')
            all.redefine[c] = new_namespace;
          else
          {
            // wildcard found: redefine all except default and break
            for (size_t i = 0; i < 256; i++) all.redefine[i] = new_namespace;
            break;  // break processing S
          }
        }
    }
  }

  if (options.was_supplied("dictionary"))
  {
    if (options.was_supplied("dictionary_path"))
      for (string path : dictionary_path)
        if (directory_exists(path))
          all.dictionary_path.push_back(path);
    if (directory_exists("."))
      all.dictionary_path.push_back(".");

    const std::string PATH = getenv("PATH");
#if _WIN32
    const char delimiter = ';';
#else
    const char delimiter = ':';
#endif
    if (!PATH.empty())
    {
      size_t previous = 0;
      size_t index = PATH.find(delimiter);
      while (index != string::npos)
      {
        all.dictionary_path.push_back(PATH.substr(previous, index - previous));
        previous = index + 1;
        index = PATH.find(delimiter, previous);
      }
      all.dictionary_path.push_back(PATH.substr(previous));
    }

    for (size_t id = 0; id < dictionary_nses.size(); id++) parse_dictionary_argument(all, dictionary_nses[id]);
  }

  if (noconstant)
    all.add_constant = false;
}